

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench.h
# Opt level: O2

void print_number(int64_t x)

{
  char *pcVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  undefined1 *puVar5;
  int iVar6;
  long lVar7;
  bool bVar8;
  char buffer [30];
  
  uVar3 = -x;
  if (0 < x) {
    uVar3 = x;
  }
  uVar2 = uVar3;
  for (uVar4 = 0; (uVar2 - 1 < 99999999 && (uVar4 < 6)); uVar4 = uVar4 + 1) {
    uVar2 = uVar2 * 10;
  }
  iVar6 = 6 - uVar4;
  uVar2 = 0;
  while (bVar8 = iVar6 != 0, iVar6 = iVar6 + -1, bVar8) {
    uVar2 = (ulong)(4 < uVar3 % 10);
    uVar3 = uVar3 / 10;
  }
  uVar2 = uVar2 + uVar3;
  buffer[0x1d] = '\0';
  if (uVar4 == 0) {
    buffer[0x1c] = '0';
    lVar7 = 0x1b;
  }
  else {
    lVar7 = 0x1c;
    while (bVar8 = uVar4 != 0, uVar4 = uVar4 - 1, bVar8) {
      buffer[lVar7] = (byte)(uVar2 % 10) | 0x30;
      lVar7 = lVar7 + -1;
      uVar2 = uVar2 / 10;
    }
  }
  buffer[lVar7] = '.';
  uVar3 = 0;
  pcVar1 = buffer;
  do {
    puVar5 = pcVar1;
    puVar5[lVar7 + -1] = (byte)(uVar2 % 10) | 0x30;
    uVar3 = uVar3 + 1;
    bVar8 = 9 < uVar2;
    uVar2 = uVar2 / 10;
    pcVar1 = puVar5 + -1;
  } while (bVar8);
  if (x < 0) {
    puVar5[lVar7 + -2] = 0x2d;
    lVar7 = (lVar7 + -1) - uVar3;
    uVar3 = (ulong)((int)uVar3 + 1);
  }
  else {
    lVar7 = lVar7 - uVar3;
  }
  printf("%5.*s",uVar3 & 0xffffffff,buffer + lVar7);
  printf("%-*s",6,buffer + (int)uVar3 + lVar7);
  return;
}

Assistant:

static void print_number(const int64_t x) {
    int64_t x_abs, y;
    int c, i, rounding, g; /* g = integer part size, c = fractional part size */
    size_t ptr;
    char buffer[30];

    if (x == INT64_MIN) {
        /* Prevent UB. */
        printf("ERR");
        return;
    }
    x_abs = x < 0 ? -x : x;

    /* Determine how many decimals we want to show (more than FP_EXP makes no
     * sense). */
    y = x_abs;
    c = 0;
    while (y > 0LL && y < 100LL * FP_MULT && c < FP_EXP) {
        y *= 10LL;
        c++;
    }

    /* Round to 'c' decimals. */
    y = x_abs;
    rounding = 0;
    for (i = c; i < FP_EXP; ++i) {
        rounding = (y % 10) >= 5;
        y /= 10;
    }
    y += rounding;

    /* Format and print the number. */
    ptr = sizeof(buffer) - 1;
    buffer[ptr] = 0;
    g = 0;
    if (c != 0) { /* non zero fractional part */
        for (i = 0; i < c; ++i) {
            buffer[--ptr] = '0' + (y % 10);
            y /= 10;
        }
    } else if (c == 0) { /* fractional part is 0 */
        buffer[--ptr] = '0'; 
    }
    buffer[--ptr] = '.';
    do {
        buffer[--ptr] = '0' + (y % 10);
        y /= 10;
        g++;
    } while (y != 0);
    if (x < 0) {
        buffer[--ptr] = '-';
        g++;
    }
    printf("%5.*s", g, &buffer[ptr]); /* Prints integer part */
    printf("%-*s", FP_EXP, &buffer[ptr + g]); /* Prints fractional part */
}